

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O2

bool __thiscall QUnixPrintWidgetPrivate::checkFields(QUnixPrintWidgetPrivate *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  char *s;
  QPrintDialog *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QFileInfo fi;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if ((*(byte *)(*(long *)((this->widget).super_Ui_QPrintWidget.filename + 0x20) + 8) & 1) != 0)
  goto LAB_00141f74;
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QLineEdit::text();
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,(QString *)&local_58);
  _fi = 0xaaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&fi,(QFileDevice *)&local_68);
  cVar1 = QFileInfo::exists();
  if (cVar1 == '\0') {
LAB_00141df3:
    cVar2 = QFile::open(&local_68,4);
    if (cVar2 == '\0') {
LAB_00141ea8:
      pQVar5 = this->q;
      QWidget::windowTitle();
      s = "File %1 is not writable.\nPlease choose a different file name.";
      goto LAB_00141ec6;
    }
    if (cVar1 == '\0') {
      QFileDevice::close();
      QFile::remove();
LAB_00141f56:
      QFileInfo::~QFileInfo(&fi);
      QFile::~QFile((QFile *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      goto LAB_00141f74;
    }
    pQVar5 = this->q;
    QWidget::windowTitle();
    QPrintDialog::tr((QString *)&QStack_b8,"%1 already exists.\nDo you want to overwrite it?",
                     (char *)0x0,-1);
    QString::arg<QString,_true>
              ((QString *)&local_a0,(QString *)&QStack_b8,(QString *)&local_58,0,(QChar)0x20);
    iVar3 = QMessageBox::question(pQVar5,&local_88,&local_a0,0x14000,0x10000);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    if (iVar3 != 0x10000) {
      QFileDevice::close();
      goto LAB_00141f56;
    }
  }
  else {
    cVar2 = QFileInfo::isDir();
    if (cVar2 == '\0') {
      cVar2 = QFileInfo::isWritable();
      if (cVar2 != '\0') goto LAB_00141df3;
      goto LAB_00141ea8;
    }
    pQVar5 = this->q;
    QWidget::windowTitle();
    s = "%1 is a directory.\nPlease choose a different file name.";
LAB_00141ec6:
    QPrintDialog::tr((QString *)&QStack_b8,s,(char *)0x0,-1);
    QString::arg<QString,_true>
              ((QString *)&local_a0,(QString *)&QStack_b8,(QString *)&local_58,0,(QChar)0x20);
    QMessageBox::warning(pQVar5,&local_88,&local_a0,0x400,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QFileInfo::~QFileInfo(&fi);
  QFile::~QFile((QFile *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  bVar4 = false;
LAB_00141f74:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QUnixPrintWidgetPrivate::checkFields()
{
    if (widget.filename->isEnabled()) {
        QString file = widget.filename->text();
        QFile f(file);
        QFileInfo fi(f);
        bool exists = fi.exists();
        bool opened = false;
        if (exists && fi.isDir()) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("%1 is a directory.\nPlease choose a different file name.").arg(file));
            return false;
        } else if ((exists && !fi.isWritable()) || !(opened = f.open(QFile::Append))) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("File %1 is not writable.\nPlease choose a different file name.").arg(file));
            return false;
        } else if (exists) {
            int ret = QMessageBox::question(q, q->windowTitle(),
                                            QPrintDialog::tr("%1 already exists.\nDo you want to overwrite it?").arg(file),
                                            QMessageBox::Yes|QMessageBox::No, QMessageBox::No);
            if (ret == QMessageBox::No)
                return false;
        }
        if (opened) {
            f.close();
            if (!exists)
                f.remove();
        }
    }

#if QT_CONFIG(cups)
    if (propertiesDialog) {
        QCUPSSupport::PagesPerSheet pagesPerSheet = qvariant_cast<QCUPSSupport::PagesPerSheet>(propertiesDialog->widget.pageSetup->m_ui.pagesPerSheetCombo
                                                                    ->currentData());

        QCUPSSupport::PageSet pageSet = qvariant_cast<QCUPSSupport::PageSet>(optionsPane->options.pageSetCombo->currentData());


        if (pagesPerSheet != QCUPSSupport::OnePagePerSheet
            && pageSet != QCUPSSupport::AllPages) {
            QMessageBox::warning(q, q->windowTitle(),
                                 QPrintDialog::tr("Options 'Pages Per Sheet' and 'Page Set' cannot be used together.\nPlease turn one of those options off."));
            return false;
        }
    }
#endif

    // Every test passed. Accept the dialog.
    return true;
}